

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPlugin.cpp
# Opt level: O2

void __thiscall
DISTRHO::Plugin::Plugin
          (Plugin *this,uint32_t parameterCount,uint32_t programCount,uint32_t stateCount)

{
  PrivateData *pPVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  Parameter *this_00;
  long lVar4;
  
  this->_vptr_Plugin = (_func_int **)&PTR__Plugin_0010ebc0;
  pPVar1 = (PrivateData *)operator_new(0x60);
  PrivateData::PrivateData(pPVar1);
  this->pData = pPVar1;
  puVar2 = (undefined8 *)operator_new__(0x108);
  *puVar2 = 4;
  lVar4 = 0;
  do {
    AudioPortWithBusId::AudioPortWithBusId
              ((AudioPortWithBusId *)
               ((long)&(((AudioPortWithBusId *)(puVar2 + 1))->super_AudioPort).hints + lVar4));
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x100);
  pPVar1 = this->pData;
  pPVar1->audioPorts = (AudioPortWithBusId *)(puVar2 + 1);
  if (parameterCount != 0) {
    pPVar1->parameterCount = parameterCount;
    lVar4 = (ulong)parameterCount * 0xb0;
    puVar3 = (ulong *)operator_new__(lVar4 + 8);
    *puVar3 = (ulong)parameterCount;
    this_00 = (Parameter *)(puVar3 + 1);
    do {
      Parameter::Parameter(this_00);
      this_00 = this_00 + 1;
      lVar4 = lVar4 + -0xb0;
    } while (lVar4 != 0);
    this->pData->parameters = (Parameter *)(puVar3 + 1);
  }
  if (programCount != 0) {
    d_stderr2("DPF warning: Plugins with programs must define `DISTRHO_PLUGIN_WANT_PROGRAMS` to 1");
  }
  if (stateCount != 0) {
    d_stderr2("DPF warning: Plugins with state must define `DISTRHO_PLUGIN_WANT_STATE` to 1");
    return;
  }
  return;
}

Assistant:

Plugin::Plugin(uint32_t parameterCount, uint32_t programCount, uint32_t stateCount)
    : pData(new PrivateData())
{
#if DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS > 0
    pData->audioPorts = new AudioPortWithBusId[DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS];
#endif

#ifdef DPF_ABORT_ON_ERROR
# define DPF_ABORT abort();
#else
# define DPF_ABORT
#endif

    if (parameterCount > 0)
    {
        pData->parameterCount = parameterCount;
        pData->parameters     = new Parameter[parameterCount];
    }

    if (programCount > 0)
    {
#if DISTRHO_PLUGIN_WANT_PROGRAMS
        pData->programCount = programCount;
        pData->programNames = new String[programCount];
#else
        d_stderr2("DPF warning: Plugins with programs must define `DISTRHO_PLUGIN_WANT_PROGRAMS` to 1");
        DPF_ABORT
#endif
    }

    if (stateCount > 0)
    {
#if DISTRHO_PLUGIN_WANT_STATE
        pData->stateCount     = stateCount;
        pData->stateKeys      = new String[stateCount];
        pData->stateDefValues = new String[stateCount];
#else
        d_stderr2("DPF warning: Plugins with state must define `DISTRHO_PLUGIN_WANT_STATE` to 1");
        DPF_ABORT
#endif
    }

#undef DPF_ABORT
}